

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O1

bool __thiscall anon_unknown.dwarf_28c34e::SndioPlayback::reset(SndioPlayback *this)

{
  ALCdevice *pAVar1;
  pointer pbVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  FILE *__stream;
  int iVar6;
  ALCchar *pAVar7;
  ulong uVar8;
  DevFmtType DVar9;
  size_t __n;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  DevFmtChannels DVar13;
  uint uVar14;
  pointer pbVar15;
  int iVar18;
  undefined1 auVar16 [16];
  int iVar19;
  undefined1 auVar17 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar34;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar35;
  int iVar37;
  undefined1 auVar36 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar38 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar39 [16];
  uint local_60;
  int local_5c;
  uint local_58;
  uint local_54;
  uint local_48;
  ALuint local_44;
  int local_40;
  ALuint local_38;
  ALuint local_34;
  
  sio_initpar(&local_60);
  pAVar1 = (this->super_BackendBase).mDevice;
  local_44 = pAVar1->Frequency;
  if ((ulong)pAVar1->FmtChans < 8) {
    local_48 = *(uint *)(&DAT_00194b54 + (ulong)pAVar1->FmtChans * 4);
  }
  switch(pAVar1->FmtType) {
  case DevFmtByte:
    local_60 = 8;
    break;
  case DevFmtUByte:
    local_60 = 8;
    goto LAB_00166703;
  case DevFmtShort:
  case DevFmtFloat:
    local_60 = 0x10;
    break;
  case DevFmtUShort:
    local_60 = 0x10;
    goto LAB_00166703;
  case DevFmtInt:
    local_60 = 0x20;
    break;
  case DevFmtUInt:
    local_60 = 0x20;
LAB_00166703:
    local_58 = 0;
  default:
    goto switchD_001666c2_default;
  }
  local_58 = 1;
switchD_001666c2_default:
  local_54 = 1;
  local_38 = pAVar1->UpdateSize;
  local_34 = pAVar1->BufferSize - local_38;
  if (local_34 == 0) {
    local_34 = local_38;
  }
  iVar6 = sio_setpar(this->mSndHandle);
  if ((iVar6 == 0) ||
     (iVar6 = sio_getpar(this->mSndHandle,&local_60), uVar14 = local_48, iVar6 == 0)) {
    if ((int)gLogLevel < 1) {
      return false;
    }
    _GLOBAL__N_1::SndioPlayback::reset();
    return false;
  }
  if (local_60 != local_5c << 3) {
    if ((int)gLogLevel < 1) {
      return false;
    }
    fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Padded samples not supported (%u of %u bits)\n");
    return false;
  }
  if (local_54 != 1) {
    if ((int)gLogLevel < 1) {
      return false;
    }
    _GLOBAL__N_1::SndioPlayback::reset((SndioPlayback *)(ulong)local_54);
    return false;
  }
  pAVar1 = (this->super_BackendBase).mDevice;
  pAVar1->Frequency = local_44;
  __stream = gLogFile;
  if (local_48 < 2) {
    if (pAVar1->FmtChans == DevFmtMono) goto LAB_00166881;
    if ((int)gLogLevel < 2) {
      DVar13 = DevFmtMono;
    }
    else {
      pAVar7 = DevFmtChannelsString(pAVar1->FmtChans);
      DVar13 = DevFmtMono;
      fprintf((FILE *)__stream,"[ALSOFT] (WW) Got %u channel for %s\n",(ulong)uVar14,pAVar7);
    }
  }
  else {
    switch(local_48) {
    case 2:
      if (pAVar1->FmtChans == DevFmtChannelsDefault) {
        switch(local_48) {
        case 4:
          goto switchD_00166803_caseD_4;
        case 5:
          break;
        case 6:
          goto switchD_00166803_caseD_6;
        case 7:
          goto switchD_00166803_caseD_7;
        case 8:
          goto switchD_00166803_caseD_8;
        default:
          goto switchD_00166803_default;
        }
      }
      break;
    case 3:
    case 5:
      break;
    case 4:
switchD_00166803_caseD_4:
      if (pAVar1->FmtChans == DevFmtQuad) {
        if (local_48 != 8) {
          if (local_48 == 7) goto switchD_00166803_caseD_7;
          if (local_48 == 6) goto switchD_00166803_caseD_6;
          goto switchD_00166803_default;
        }
        goto switchD_00166803_caseD_8;
      }
      break;
    case 6:
switchD_00166803_caseD_6:
      if ((pAVar1->FmtChans | DevFmtX61) == DevFmtX51Rear) {
        if (local_48 != 8) {
          if (local_48 == 7) goto switchD_00166803_caseD_7;
          goto switchD_00166803_default;
        }
        goto switchD_00166803_caseD_8;
      }
      break;
    case 7:
switchD_00166803_caseD_7:
      if (pAVar1->FmtChans == DevFmtX61) {
        if (local_48 != 8) goto switchD_00166803_default;
        goto switchD_00166803_caseD_8;
      }
      break;
    case 8:
switchD_00166803_caseD_8:
      if (pAVar1->FmtChans == DevFmtX71) goto LAB_00166881;
      break;
    default:
switchD_00166803_default:
      if (local_48 < 9) goto LAB_00166881;
    }
    DVar13 = DevFmtChannelsDefault;
    if (1 < (int)gLogLevel) {
      _GLOBAL__N_1::SndioPlayback::reset();
    }
  }
  ((this->super_BackendBase).mDevice)->FmtChans = DVar13;
LAB_00166881:
  uVar14 = local_58 ^ 1;
  if ((local_60 ^ 8) == 0 && uVar14 == 0) {
    DVar9 = DevFmtByte;
  }
  else {
    DVar9 = DevFmtUByte;
    if ((local_60 ^ 8) != 0 || local_58 != 0) {
      DVar9 = DevFmtShort;
      if (((local_60 ^ 0x10) != 0 || uVar14 != 0) &&
         (DVar9 = DevFmtUShort, (local_60 ^ 0x10) != 0 || local_58 != 0)) {
        DVar9 = DevFmtInt;
        if ((uVar14 != 0 || (local_60 ^ 0x20) != 0) &&
           (DVar9 = DevFmtUInt, (local_60 ^ 0x20) != 0 || local_58 != 0)) {
          if ((int)gLogLevel < 1) {
            return false;
          }
          pcVar12 = "signed";
          if (local_58 == 0) {
            pcVar12 = "unsigned";
          }
          fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unhandled sample format: %s %u-bit\n",pcVar12);
          return false;
        }
      }
    }
  }
  ((this->super_BackendBase).mDevice)->FmtType = DVar9;
  BackendBase::setDefaultChannelOrder(&this->super_BackendBase);
  pAVar1 = (this->super_BackendBase).mDevice;
  pAVar1->UpdateSize = local_38;
  pAVar1->BufferSize = local_40 + local_38;
  std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::resize
            (&this->mBuffer,(ulong)(local_38 * local_48 * local_5c));
  auVar17 = _DAT_00194670;
  auVar21 = _DAT_00194660;
  auVar5 = _DAT_0017a550;
  auVar4 = _DAT_0017a540;
  auVar3 = _DAT_00179530;
  if (local_58 == 1) {
    pbVar15 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
              super__Vector_impl_data._M_start;
    pbVar2 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pbVar15 == pbVar2) {
      return true;
    }
    __n = (long)pbVar2 - (long)pbVar15;
    iVar6 = 0;
  }
  else {
    if (local_60 == 0x20) {
      pbVar15 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar8 = (long)(this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pbVar15;
      if (3 < uVar8) {
        uVar8 = uVar8 - 4;
        auVar21._8_4_ = (int)uVar8;
        auVar21._0_8_ = uVar8;
        auVar21._12_4_ = (int)(uVar8 >> 0x20);
        auVar17._0_8_ = uVar8 >> 2;
        auVar17._8_8_ = auVar21._8_8_ >> 2;
        uVar11 = 0;
        auVar17 = auVar17 ^ _DAT_00179530;
        do {
          auVar22._8_4_ = (int)uVar11;
          auVar22._0_8_ = uVar11;
          auVar22._12_4_ = (int)(uVar11 >> 0x20);
          auVar21 = (auVar22 | auVar5) ^ auVar3;
          iVar6 = auVar17._4_4_;
          if ((bool)(~(auVar21._4_4_ == iVar6 && auVar17._0_4_ < auVar21._0_4_ ||
                      iVar6 < auVar21._4_4_) & 1)) {
            pbVar2 = pbVar15 + uVar11 * 4;
            pbVar2[0] = 0;
            pbVar2[1] = 0;
            pbVar2[2] = 0;
            pbVar2[3] = 0x80;
          }
          if ((auVar21._12_4_ != auVar17._12_4_ || auVar21._8_4_ <= auVar17._8_4_) &&
              auVar21._12_4_ <= auVar17._12_4_) {
            pbVar2 = pbVar15 + uVar11 * 4 + 4;
            pbVar2[0] = 0;
            pbVar2[1] = 0;
            pbVar2[2] = 0;
            pbVar2[3] = 0x80;
          }
          auVar21 = (auVar22 | auVar4) ^ auVar3;
          iVar18 = auVar21._4_4_;
          if (iVar18 <= iVar6 && (iVar18 != iVar6 || auVar21._0_4_ <= auVar17._0_4_)) {
            pbVar2 = pbVar15 + uVar11 * 4 + 8;
            pbVar2[0] = 0;
            pbVar2[1] = 0;
            pbVar2[2] = 0;
            pbVar2[3] = 0x80;
            pbVar2 = pbVar15 + uVar11 * 4 + 0xc;
            pbVar2[0] = 0;
            pbVar2[1] = 0;
            pbVar2[2] = 0;
            pbVar2[3] = 0x80;
          }
          uVar11 = uVar11 + 4;
        } while (((uVar8 >> 2) + 4 & 0x7ffffffffffffffc) != uVar11);
        return true;
      }
      return true;
    }
    if (local_60 == 0x10) {
      pbVar15 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar8 = (long)(this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pbVar15;
      if (1 < uVar8) {
        uVar8 = uVar8 - 2;
        auVar38._8_4_ = (int)uVar8;
        auVar38._0_8_ = uVar8;
        auVar38._12_4_ = (int)(uVar8 >> 0x20);
        auVar16._0_8_ = uVar8 >> 1;
        auVar16._8_8_ = auVar38._8_8_ >> 1;
        lVar10 = 0;
        auVar16 = auVar16 ^ _DAT_00179530;
        auVar20._8_4_ = 0xffffffff;
        auVar20._0_8_ = 0xffffffffffffffff;
        auVar20._12_4_ = 0xffffffff;
        do {
          auVar29._8_4_ = (int)lVar10;
          auVar29._0_8_ = lVar10;
          auVar29._12_4_ = (int)((ulong)lVar10 >> 0x20);
          auVar22 = (auVar29 | auVar5) ^ auVar3;
          iVar6 = auVar16._0_4_;
          iVar35 = -(uint)(iVar6 < auVar22._0_4_);
          iVar18 = auVar16._4_4_;
          auVar23._4_4_ = -(uint)(iVar18 < auVar22._4_4_);
          iVar34 = auVar16._8_4_;
          iVar37 = -(uint)(iVar34 < auVar22._8_4_);
          iVar19 = auVar16._12_4_;
          auVar23._12_4_ = -(uint)(iVar19 < auVar22._12_4_);
          auVar31._4_4_ = iVar35;
          auVar31._0_4_ = iVar35;
          auVar31._8_4_ = iVar37;
          auVar31._12_4_ = iVar37;
          auVar38 = pshuflw(in_XMM11,auVar31,0xe8);
          auVar25._4_4_ = -(uint)(auVar22._4_4_ == iVar18);
          auVar25._12_4_ = -(uint)(auVar22._12_4_ == iVar19);
          auVar25._0_4_ = auVar25._4_4_;
          auVar25._8_4_ = auVar25._12_4_;
          auVar39 = pshuflw(in_XMM12,auVar25,0xe8);
          auVar23._0_4_ = auVar23._4_4_;
          auVar23._8_4_ = auVar23._12_4_;
          auVar22 = pshuflw(auVar38,auVar23,0xe8);
          auVar22 = (auVar22 | auVar39 & auVar38) ^ auVar20;
          auVar22 = packssdw(auVar22,auVar22);
          if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            (pbVar15 + lVar10 * 2)[0] = 0;
            (pbVar15 + lVar10 * 2)[1] = 0x80;
          }
          auVar23 = auVar25 & auVar31 | auVar23;
          auVar22 = packssdw(auVar23,auVar23);
          auVar22 = packssdw(auVar22 ^ auVar20,auVar22 ^ auVar20);
          if ((auVar22._0_4_ >> 0x10 & 1) != 0) {
            (pbVar15 + lVar10 * 2 + 2)[0] = 0;
            (pbVar15 + lVar10 * 2 + 2)[1] = 0x80;
          }
          auVar22 = (auVar29 | auVar4) ^ auVar3;
          iVar35 = -(uint)(iVar6 < auVar22._0_4_);
          auVar36._4_4_ = -(uint)(iVar18 < auVar22._4_4_);
          iVar37 = -(uint)(iVar34 < auVar22._8_4_);
          auVar36._12_4_ = -(uint)(iVar19 < auVar22._12_4_);
          auVar24._4_4_ = iVar35;
          auVar24._0_4_ = iVar35;
          auVar24._8_4_ = iVar37;
          auVar24._12_4_ = iVar37;
          auVar30._4_4_ = -(uint)(auVar22._4_4_ == iVar18);
          auVar30._12_4_ = -(uint)(auVar22._12_4_ == iVar19);
          auVar30._0_4_ = auVar30._4_4_;
          auVar30._8_4_ = auVar30._12_4_;
          auVar36._0_4_ = auVar36._4_4_;
          auVar36._8_4_ = auVar36._12_4_;
          auVar22 = auVar30 & auVar24 | auVar36;
          auVar22 = packssdw(auVar22,auVar22);
          auVar22 = packssdw(auVar22 ^ auVar20,auVar22 ^ auVar20);
          if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            (pbVar15 + lVar10 * 2 + 4)[0] = 0;
            (pbVar15 + lVar10 * 2 + 4)[1] = 0x80;
          }
          auVar25 = pshufhw(auVar24,auVar24,0x84);
          auVar31 = pshufhw(auVar30,auVar30,0x84);
          auVar23 = pshufhw(auVar25,auVar36,0x84);
          auVar25 = (auVar23 | auVar31 & auVar25) ^ auVar20;
          auVar25 = packssdw(auVar25,auVar25);
          if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            (pbVar15 + lVar10 * 2 + 6)[0] = 0;
            (pbVar15 + lVar10 * 2 + 6)[1] = 0x80;
          }
          auVar25 = (auVar29 | auVar17) ^ auVar3;
          iVar35 = -(uint)(iVar6 < auVar25._0_4_);
          auVar27._4_4_ = -(uint)(iVar18 < auVar25._4_4_);
          iVar37 = -(uint)(iVar34 < auVar25._8_4_);
          auVar27._12_4_ = -(uint)(iVar19 < auVar25._12_4_);
          auVar32._4_4_ = iVar35;
          auVar32._0_4_ = iVar35;
          auVar32._8_4_ = iVar37;
          auVar32._12_4_ = iVar37;
          auVar22 = pshuflw(auVar22,auVar32,0xe8);
          auVar26._4_4_ = -(uint)(auVar25._4_4_ == iVar18);
          auVar26._12_4_ = -(uint)(auVar25._12_4_ == iVar19);
          auVar26._0_4_ = auVar26._4_4_;
          auVar26._8_4_ = auVar26._12_4_;
          in_XMM12 = pshuflw(auVar39 & auVar38,auVar26,0xe8);
          in_XMM12 = in_XMM12 & auVar22;
          auVar27._0_4_ = auVar27._4_4_;
          auVar27._8_4_ = auVar27._12_4_;
          auVar22 = pshuflw(auVar22,auVar27,0xe8);
          auVar22 = (auVar22 | in_XMM12) ^ auVar20;
          in_XMM11 = packssdw(auVar22,auVar22);
          if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            (pbVar15 + lVar10 * 2 + 8)[0] = 0;
            (pbVar15 + lVar10 * 2 + 8)[1] = 0x80;
          }
          auVar27 = auVar26 & auVar32 | auVar27;
          auVar22 = packssdw(auVar27,auVar27);
          auVar22 = packssdw(auVar22 ^ auVar20,auVar22 ^ auVar20);
          if ((auVar22 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            (pbVar15 + lVar10 * 2 + 10)[0] = 0;
            (pbVar15 + lVar10 * 2 + 10)[1] = 0x80;
          }
          auVar22 = (auVar29 | auVar21) ^ auVar3;
          iVar6 = -(uint)(iVar6 < auVar22._0_4_);
          auVar33._4_4_ = -(uint)(iVar18 < auVar22._4_4_);
          iVar34 = -(uint)(iVar34 < auVar22._8_4_);
          auVar33._12_4_ = -(uint)(iVar19 < auVar22._12_4_);
          auVar28._4_4_ = iVar6;
          auVar28._0_4_ = iVar6;
          auVar28._8_4_ = iVar34;
          auVar28._12_4_ = iVar34;
          auVar39._4_4_ = -(uint)(auVar22._4_4_ == iVar18);
          auVar39._12_4_ = -(uint)(auVar22._12_4_ == iVar19);
          auVar39._0_4_ = auVar39._4_4_;
          auVar39._8_4_ = auVar39._12_4_;
          auVar33._0_4_ = auVar33._4_4_;
          auVar33._8_4_ = auVar33._12_4_;
          auVar22 = auVar39 & auVar28 | auVar33;
          auVar22 = packssdw(auVar22,auVar22);
          auVar22 = packssdw(auVar22 ^ auVar20,auVar22 ^ auVar20);
          if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            (pbVar15 + lVar10 * 2 + 0xc)[0] = 0;
            (pbVar15 + lVar10 * 2 + 0xc)[1] = 0x80;
          }
          auVar38 = pshufhw(auVar28,auVar28,0x84);
          auVar22 = pshufhw(auVar39,auVar39,0x84);
          auVar29 = pshufhw(auVar38,auVar33,0x84);
          auVar22 = packssdw(auVar22 & auVar38,(auVar29 | auVar22 & auVar38) ^ auVar20);
          if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            (pbVar15 + lVar10 * 2 + 0xe)[0] = 0;
            (pbVar15 + lVar10 * 2 + 0xe)[1] = 0x80;
          }
          lVar10 = lVar10 + 8;
        } while ((uVar8 >> 4) * 8 + 8 != lVar10);
        return true;
      }
      return true;
    }
    if (local_60 != 8) {
      return true;
    }
    pbVar15 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
              super__Vector_impl_data._M_start;
    __n = (long)(this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pbVar15;
    if (__n == 0) {
      return true;
    }
    iVar6 = 0x80;
  }
  memset(pbVar15,iVar6,__n);
  return true;
}

Assistant:

bool SndioPlayback::reset()
{
    sio_par par;
    sio_initpar(&par);

    par.rate = mDevice->Frequency;
    switch(mDevice->FmtChans)
    {
    case DevFmtMono   : par.pchan = 1; break;
    case DevFmtQuad   : par.pchan = 4; break;
    case DevFmtX51Rear: // fall-through - "Similar to 5.1, except using rear channels instead of sides"
    case DevFmtX51    : par.pchan = 6; break;
    case DevFmtX61    : par.pchan = 7; break;
    case DevFmtX71    : par.pchan = 8; break;

    // fall back to stereo for Ambi3D
    case DevFmtAmbi3D : // fall-through
    case DevFmtStereo : par.pchan = 2; break;
    }

    switch(mDevice->FmtType)
    {
    case DevFmtByte:
        par.bits = 8;
        par.sig = 1;
        break;
    case DevFmtUByte:
        par.bits = 8;
        par.sig = 0;
        break;
    case DevFmtFloat:
    case DevFmtShort:
        par.bits = 16;
        par.sig = 1;
        break;
    case DevFmtUShort:
        par.bits = 16;
        par.sig = 0;
        break;
    case DevFmtInt:
        par.bits = 32;
        par.sig = 1;
        break;
    case DevFmtUInt:
        par.bits = 32;
        par.sig = 0;
        break;
    }
    par.le = SIO_LE_NATIVE;

    par.round = mDevice->UpdateSize;
    par.appbufsz = mDevice->BufferSize - mDevice->UpdateSize;
    if(!par.appbufsz) par.appbufsz = mDevice->UpdateSize;

    if(!sio_setpar(mSndHandle, &par) || !sio_getpar(mSndHandle, &par))
    {
        ERR("Failed to set device parameters\n");
        return false;
    }

    if(par.bits != par.bps*8)
    {
        ERR("Padded samples not supported (%u of %u bits)\n", par.bits, par.bps*8);
        return false;
    }
    if(par.le != SIO_LE_NATIVE)
    {
        ERR("Non-native-endian samples not supported (got %s-endian)\n",
            par.le ? "little" : "big");
        return false;
    }

    mDevice->Frequency = par.rate;

    if(par.pchan < 2)
    {
        if(mDevice->FmtChans != DevFmtMono)
        {
            WARN("Got %u channel for %s\n", par.pchan, DevFmtChannelsString(mDevice->FmtChans));
            mDevice->FmtChans = DevFmtMono;
        }
    }
    else if((par.pchan == 2 && mDevice->FmtChans != DevFmtStereo)
        || par.pchan == 3
        || (par.pchan == 4 && mDevice->FmtChans != DevFmtQuad)
        || par.pchan == 5
        || (par.pchan == 6 && mDevice->FmtChans != DevFmtX51 && mDevice->FmtChans != DevFmtX51Rear)
        || (par.pchan == 7 && mDevice->FmtChans != DevFmtX61)
        || (par.pchan == 8 && mDevice->FmtChans != DevFmtX71)
        || par.pchan > 8)
    {
        WARN("Got %u channels for %s\n", par.pchan, DevFmtChannelsString(mDevice->FmtChans));
        mDevice->FmtChans = DevFmtStereo;
    }

    if(par.bits == 8 && par.sig == 1)
        mDevice->FmtType = DevFmtByte;
    else if(par.bits == 8 && par.sig == 0)
        mDevice->FmtType = DevFmtUByte;
    else if(par.bits == 16 && par.sig == 1)
        mDevice->FmtType = DevFmtShort;
    else if(par.bits == 16 && par.sig == 0)
        mDevice->FmtType = DevFmtUShort;
    else if(par.bits == 32 && par.sig == 1)
        mDevice->FmtType = DevFmtInt;
    else if(par.bits == 32 && par.sig == 0)
        mDevice->FmtType = DevFmtUInt;
    else
    {
        ERR("Unhandled sample format: %s %u-bit\n", (par.sig?"signed":"unsigned"), par.bits);
        return false;
    }

    setDefaultChannelOrder();

    mDevice->UpdateSize = par.round;
    mDevice->BufferSize = par.bufsz + par.round;

    mBuffer.resize(mDevice->UpdateSize * par.pchan*par.bps);
    if(par.sig == 1)
        std::fill(mBuffer.begin(), mBuffer.end(), al::byte{});
    else if(par.bits == 8)
        std::fill_n(mBuffer.data(), mBuffer.size(), al::byte(0x80));
    else if(par.bits == 16)
        std::fill_n(reinterpret_cast<uint16_t*>(mBuffer.data()), mBuffer.size()/2, 0x8000);
    else if(par.bits == 32)
        std::fill_n(reinterpret_cast<uint32_t*>(mBuffer.data()), mBuffer.size()/4, 0x80000000u);

    return true;
}